

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O2

int Abc_NodeCompareLevelsInc(int *pp1,int *pp2)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  uint uVar5;
  
  pvVar3 = Vec_PtrEntry(s_pLeaves,*pp1);
  pvVar4 = Vec_PtrEntry(s_pLeaves,*pp2);
  uVar5 = *(uint *)((long)pvVar3 + 0x14) >> 0xc;
  uVar1 = *(uint *)((long)pvVar4 + 0x14) >> 0xc;
  uVar2 = 0xffffffff;
  if (uVar1 <= uVar5) {
    uVar2 = (uint)(uVar1 < uVar5);
  }
  return uVar2;
}

Assistant:

int Abc_NodeCompareLevelsInc( int * pp1, int * pp2 )
{
    Abc_Obj_t * pNode1, * pNode2;
    pNode1 = (Abc_Obj_t *)Vec_PtrEntry(s_pLeaves, *pp1);
    pNode2 = (Abc_Obj_t *)Vec_PtrEntry(s_pLeaves, *pp2);
    if ( pNode1->Level < pNode2->Level )
        return -1;
    if ( pNode1->Level > pNode2->Level ) 
        return 1;
    return 0; 
}